

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InputAsciiHexDecodeStream.cpp
# Opt level: O0

void __thiscall InputAsciiHexDecodeStream::ReadNextBuffer(InputAsciiHexDecodeStream *this)

{
  int iVar1;
  byte local_29;
  unsigned_long encodedValue;
  int readIndex;
  Byte aByte;
  Byte buffer [2];
  InputAsciiHexDecodeStream *this_local;
  
  encodedValue._5_1_ = 0;
  encodedValue._0_4_ = 0;
  _readIndex = this;
  while( true ) {
    while( true ) {
      local_29 = 0;
      if ((int)encodedValue < 2) {
        iVar1 = (*this->mSourceStream->_vptr_IByteReader[3])();
        local_29 = (byte)iVar1;
      }
      if ((local_29 & 1) == 0) goto LAB_002bbb97;
      (*this->mSourceStream->_vptr_IByteReader[2])(this->mSourceStream,(long)&encodedValue + 5,1);
      if ((encodedValue._5_1_ < 0x21) || (0x75 < encodedValue._5_1_)) break;
      *(byte *)((long)&encodedValue + (long)(int)encodedValue + 6) = encodedValue._5_1_;
      encodedValue._0_4_ = (int)encodedValue + 1;
    }
    if (encodedValue._5_1_ == 0x7a) break;
    if ((encodedValue._5_1_ == 0x7e) &&
       ((*this->mSourceStream->_vptr_IByteReader[2])(this->mSourceStream,(long)&encodedValue + 5,1),
       encodedValue._5_1_ == 0x3e)) {
      this->mHitEnd = true;
LAB_002bbb97:
      if (0 < (int)encodedValue) {
        if (encodedValue._6_1_ == 0x7a) {
          this->mBuffer[3] = '\0';
          this->mBuffer[2] = '\0';
          this->mBuffer[1] = '\0';
          this->mBuffer[0] = '\0';
          this->mReadBufferIndex = 0;
          this->mReadBufferSize = 4;
        }
        else {
          iVar1 = 0;
          if ((encodedValue._6_1_ < 0x30) || (0x39 < encodedValue._6_1_)) {
            if ((encodedValue._6_1_ < 0x41) || (0x46 < encodedValue._6_1_)) {
              if ((0x60 < encodedValue._6_1_) && (encodedValue._6_1_ < 0x67)) {
                iVar1 = (encodedValue._6_1_ - 0x57) * 0x10;
              }
            }
            else {
              iVar1 = (encodedValue._6_1_ - 0x37) * 0x10;
            }
          }
          else {
            iVar1 = (encodedValue._6_1_ - 0x30) * 0x10;
          }
          if ((encodedValue._7_1_ < 0x30) || (0x39 < encodedValue._7_1_)) {
            if ((encodedValue._7_1_ < 0x41) || (0x46 < encodedValue._7_1_)) {
              if ((0x60 < encodedValue._7_1_) && (encodedValue._7_1_ < 0x67)) {
                iVar1 = (encodedValue._7_1_ - 0x57) + iVar1;
              }
            }
            else {
              iVar1 = (encodedValue._7_1_ - 0x37) + iVar1;
            }
          }
          else {
            iVar1 = (encodedValue._7_1_ - 0x30) + iVar1;
          }
          *(int *)this->mBuffer = iVar1;
          this->mReadBufferIndex = 0;
          this->mReadBufferSize = (int)encodedValue + -1;
        }
      }
      return;
    }
  }
  *(undefined1 *)((long)&encodedValue + (long)(int)encodedValue + 6) = 0x7a;
  encodedValue._0_4_ = (int)encodedValue + 1;
  goto LAB_002bbb97;
}

Assistant:

void InputAsciiHexDecodeStream::ReadNextBuffer()
{
	Byte buffer[2];
	Byte aByte = 0;
	int readIndex = 0;
	
	while(readIndex < 2 && mSourceStream->NotEnded())
	{
		mSourceStream->Read(&aByte,1);

		if(33 <= aByte && aByte<= 117)
		{
			buffer[readIndex] = aByte;
			++readIndex;
		}
		else if(aByte == 122)
		{
			// z - special case
			buffer[readIndex] = aByte;
			++readIndex;
			break;
		}
		else if(aByte == 126)
		{
			// EOD marker
			mSourceStream->Read(&aByte,1);
			if(aByte == 62)
			{
				mHitEnd = true;
				break;
			}
		}
		// else, continue to next character, skipping space and invalid

	}

	// if there's anything to decode
	if(readIndex > 0)
	{
		if(buffer[0] == 122)
		{
			// special case Z
			mBuffer[0] = mBuffer[1] = mBuffer[2] = mBuffer[3] = 0;
			mReadBufferIndex = 0;
			mReadBufferSize = 4;
		}
		else
		{
			unsigned long encodedValue = 0;

			if (buffer[0] >= '0' && buffer[0] <= '9') {
				encodedValue = (buffer[0] - '0') << 4;
			}
			else if (buffer[0] >= 'A' && buffer[0] <= 'F') {
				encodedValue = (buffer[0] - 'A' + 10) << 4;
			}
			else if (buffer[0] >= 'a' && buffer[0] <= 'f') {
				encodedValue = (buffer[0] - 'a' + 10) << 4;
			}

			if (buffer[1] >= '0' && buffer[1] <= '9') {
				encodedValue += buffer[1] - '0';
			}
			else if (buffer[1] >= 'A' && buffer[1] <= 'F') {
				encodedValue += buffer[1] - 'A' + 10;
			}
			else if (buffer[1] >= 'a' && buffer[1] <= 'f') {
				encodedValue += buffer[1] - 'a' + 10;
			}

			memcpy(mBuffer, &encodedValue,4);
			mReadBufferIndex = 0;
			mReadBufferSize = readIndex-1;
		}

	}
}